

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanical.cpp
# Opt level: O2

Vector3d * __thiscall
Mechanization::CalculateVfkb(Vector3d *__return_storage_ptr__,Mechanization *this,Output now)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Vector3d ScullingCompensation;
  Vector3d RotationCompensation;
  double dStack_140;
  double local_120;
  double *local_118;
  double *local_110;
  undefined1 local_100 [16];
  scalar_constant_op<double> local_f0;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_e0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_88 [16];
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_48 [24];
  
  local_68 = now.ax;
  dStack_60 = now.ay;
  local_58 = now.az;
  dVar1 = (this->prvOut).gx;
  dVar2 = (this->prvOut).ax;
  local_118 = (double *)0x3fe0000000000000;
  auVar3._8_4_ = now.gx._0_4_;
  auVar3._0_8_ = now.gz;
  auVar3._12_4_ = now.gx._4_4_;
  dVar4 = now.gz * now.ax - now.az * now.gx;
  local_78 = now.gx * now.ay - now.ax * now.gy;
  local_88._8_4_ = SUB84(dVar4,0);
  local_88._0_8_ = now.gy * now.az - now.ay * now.gz;
  local_88._12_4_ = (int)((ulong)dVar4 >> 0x20);
  dVar4 = (this->prvOut).gy;
  dVar5 = (this->prvOut).gz;
  dVar6 = (this->prvOut).ay;
  dVar7 = (this->prvOut).az;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_100,(double *)&local_118,(StorageBaseType *)local_88);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_48,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)local_100);
  local_120 = 0.08333333333333333;
  local_118 = &local_a8;
  dStack_140 = auVar3._8_8_;
  local_c8 = now.gz * dVar6 - dVar7 * now.gy;
  dStack_c0 = dStack_140 * dVar7 - dVar2 * now.gz;
  local_b8 = dVar2 * now.gy - now.gx * dVar6;
  local_110 = &local_c8;
  local_a8 = now.az * dVar4 - dVar5 * now.ay;
  dStack_a0 = now.ax * dVar5 - dVar1 * now.az;
  local_98 = now.ay * dVar1 - now.ax * dVar4;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)local_100,&local_120,(StorageBaseType *)&local_118);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_88,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                       *)local_100);
  local_100._8_8_ = &local_68;
  local_f0.m_other = (double)local_48;
  local_e0 = local_88;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_100);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Mechanization::CalculateVfkb(Output now) {
    Vector3d deltaVk(now.ax, now.ay, now.az);
    Vector3d deltaThetak(now.gx, now.gy, now.gz);

    Vector3d deltaVkPrv(prvOut.ax, prvOut.ay, prvOut.az);
    Vector3d deltaThetaPrv(prvOut.gx, prvOut.gy, prvOut.gz);

    Vector3d RotationCompensation = 0.5 * deltaThetak.cross(deltaVk);
    Vector3d ScullingCompensation = 1.0 / 12.0 * (deltaThetaPrv.cross(deltaVk) + deltaVkPrv.cross(deltaThetak));

    return (deltaVk + RotationCompensation + ScullingCompensation);
}